

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int plan2duu(PlannerType plannerType,char *envCfgFilename)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  vector<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
  SolutionPolicy;
  float ProbofReachGoal;
  float ExpectedCost;
  PPCPPlanner planner;
  EnvironmentNAV2DUU environment_nav2Duu;
  MDPConfig MDPCfg;
  double allocated_time_secs;
  int bRet;
  char *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd50;
  float local_258 [6];
  float local_240;
  float local_23c;
  PPCPPlanner local_238 [48];
  MDPConfig local_208 [61];
  double local_20;
  int local_14;
  
  local_14 = 0;
  local_20 = 10.0;
  EnvironmentNAV2DUU::EnvironmentNAV2DUU((EnvironmentNAV2DUU *)local_208);
  bVar1 = EnvironmentNAV2DUU::InitializeEnv((char *)local_208);
  if ((bVar1 & 1) == 0) {
    uVar4 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               in_stack_fffffffffffffd38);
    __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  bVar1 = EnvironmentNAV2DUU::InitializeMDPCfg(local_208);
  if ((bVar1 & 1) == 0) {
    uVar4 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               in_stack_fffffffffffffd38);
    __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar2 = EnvironmentNAV2DUU::SizeofCreatedEnv();
  iVar3 = EnvironmentNAV2DUU::SizeofH();
  PPCPPlanner::PPCPPlanner(local_238,(DiscreteSpaceInformation *)local_208,iVar2,iVar3);
  iVar2 = PPCPPlanner::set_start((int)local_238);
  if (iVar2 == 0) {
    uVar4 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               in_stack_fffffffffffffd38);
    __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar2 = PPCPPlanner::set_goal((int)local_238);
  if (iVar2 == 0) {
    uVar4 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               in_stack_fffffffffffffd38);
    __cxa_throw(uVar4,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  printf("start planning...\n");
  std::vector<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>::
  vector((vector<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
          *)0x10d0b4);
  iVar2 = PPCPPlanner::replan(local_20,(vector *)local_238,local_258,&local_23c);
  local_14 = iVar2;
  printf("done planning\n");
  if (local_14 == 0) {
    printf("Solution does not exist\n");
  }
  else {
    printf("Solution is found: exp. cost=%f probofreachgoal=%f\n",(double)local_23c,
           (double)local_240);
  }
  fflush((FILE *)0x0);
  iVar3 = local_14;
  std::vector<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>::
  ~vector((vector<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
           *)CONCAT44(iVar2,in_stack_fffffffffffffd50));
  PPCPPlanner::~PPCPPlanner(local_238);
  EnvironmentNAV2DUU::~EnvironmentNAV2DUU((EnvironmentNAV2DUU *)0x10d1a2);
  return iVar3;
}

Assistant:

int plan2duu(PlannerType plannerType, char* envCfgFilename)
{
    int bRet = 0;
    double allocated_time_secs = 10.0; //in seconds
    MDPConfig MDPCfg;

    //Initialize Environment (should be called before initializing anything else)
    EnvironmentNAV2DUU environment_nav2Duu;
    if (!environment_nav2Duu.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    //Initialize MDP Info
    if (!environment_nav2Duu.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    //create the planner
    PPCPPlanner planner(&environment_nav2Duu, environment_nav2Duu.SizeofCreatedEnv(), environment_nav2Duu.SizeofH());

    //set start and goal
    if (planner.set_start(MDPCfg.startstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set start state");
    }
    if (planner.set_goal(MDPCfg.goalstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set goal state");
    }

    printf("start planning...\n");
    float ExpectedCost, ProbofReachGoal;
    vector<sbpl_PolicyStatewithBinaryh_t> SolutionPolicy;
    bRet = planner.replan(allocated_time_secs, &SolutionPolicy, &ExpectedCost, &ProbofReachGoal);
    printf("done planning\n");

    if (bRet) {
        //print the solution
        printf("Solution is found: exp. cost=%f probofreachgoal=%f\n", ExpectedCost, ProbofReachGoal);
    }
    else {
        printf("Solution does not exist\n");
    }

    fflush(NULL);

    return bRet;
}